

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test>::CreateTest
          (ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<char_const*,pstore::repo::section_kind>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x158);
  InternalFixupSectionNames_SectionName_Test::InternalFixupSectionNames_SectionName_Test
            ((InternalFixupSectionNames_SectionName_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }